

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
          (ParserRefImpl<Catch::clara::detail::Opt> *this,
          shared_ptr<Catch::clara::detail::BoundRef> *ref)

{
  shared_ptr<Catch::clara::detail::BoundRef> *in_RSI;
  shared_ptr<Catch::clara::detail::BoundRef> *in_RDI;
  
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl
            ((ComposableParserImpl<Catch::clara::detail::Opt> *)in_RSI);
  (in_RDI->super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ParserRefImpl_0054cc10;
  *(undefined4 *)
   &(in_RDI->super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = 0;
  std::shared_ptr<Catch::clara::detail::BoundRef>::shared_ptr(in_RSI,in_RDI);
  ::std::__cxx11::string::string((string *)(in_RDI + 2));
  ::std::__cxx11::string::string((string *)(in_RDI + 4));
  return;
}

Assistant:

explicit ParserRefImpl( std::shared_ptr<BoundRef> const &ref ) : m_ref( ref ) {}